

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::Clara::Detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2959:43)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2959:43)>
          *this,string *arg)

{
  ColourMode CVar1;
  ColourMode *pCVar2;
  StringRef colourMode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  Optional<Catch::ColourMode> local_68;
  BasicResult<Catch::Clara::ParseResultType> local_58;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&local_88);
  local_58.m_errorMessage._M_dataplus._M_p = (pointer)&local_58.m_errorMessage.field_2;
  local_58.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type = Ok;
  local_58.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_ = 0;
  local_58.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_002f3d40;
  local_58.m_errorMessage._M_string_length = 0;
  local_58.m_errorMessage.field_2._M_local_buf[0] = '\0';
  toLower(&local_c8,&local_88);
  colourMode.m_size = (size_type)local_c8._M_dataplus._M_p;
  colourMode.m_start = (char *)&local_68;
  Catch::Detail::stringToColourMode(colourMode);
  std::__cxx11::string::~string((string *)&local_c8);
  if (local_68.nullableValue == (ColourMode *)0x0) {
    std::operator+(&local_a8,"colour mode must be one of: default, ansi, win32, or none. \'",
                   &local_88);
    std::operator+(&local_c8,&local_a8,"\' is not recognised");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&local_c8);
  }
  else {
    pCVar2 = Optional<Catch::ColourMode>::operator*(&local_68);
    CVar1 = *pCVar2;
    if ((CVar1 < 4) && (CVar1 != Win32)) {
      ((this->m_lambda).config)->defaultColourMode = CVar1;
      *(undefined8 *)
       &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
        super_ResultBase.m_type = 0;
      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).
      super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_002f3d40;
      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
      (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
      (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
      goto LAB_001670a0;
    }
    std::operator+(&local_a8,"colour mode \'",&local_88);
    std::operator+(&local_c8,&local_a8,"\' is not supported in this binary");
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(__return_storage_ptr__,&local_c8);
  }
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
LAB_001670a0:
  BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&local_58);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const& arg )
                    -> ParserResult override {
                    return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>(
                        m_lambda, arg );
                }